

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void GUILog(HGUI handle,string *log)

{
  ulong uVar1;
  GUI *gui;
  string *log_local;
  HGUI handle_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)((long)handle + 0x1a0ca8),"\n");
  }
  std::__cxx11::string::operator+=((string *)((long)handle + 0x1a0ca8),(string *)log);
  return;
}

Assistant:

void GUILog(HGUI handle, std::string log) {
    GUI* gui = (GUI*)handle;
    if (!gui->Log.empty()) {
        gui->Log += "\n";
    }
    gui->Log += log;
}